

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O0

uint32_t read32_le(uint8_t *buf)

{
  uint8_t *buf_local;
  
  return (uint)buf[3] << 0x18 | (uint)buf[2] << 0x10 | (uint)buf[1] << 8 | (uint)*buf;
}

Assistant:

static inline uint32_t read32_le(const uint8_t buf[4])
{
  return (buf[3] << 24) |
         (buf[2] << 16) |
         (buf[1] << 8) |
         (buf[0]);
}